

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_145302::BuildSystemFileDelegate::configureClient
          (BuildSystemFileDelegate *this,ConfigureContext *ctx,StringRef name,uint32_t version,
          property_list_type *properties)

{
  bool bVar1;
  uint32_t uVar2;
  BuildSystemDelegate *pBVar3;
  reference ppVar4;
  size_t sVar5;
  char *__s1;
  StringRef SVar6;
  bool local_1bd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  Twine local_178;
  undefined1 local_160 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  prop;
  const_iterator __end1;
  const_iterator __begin1;
  property_list_type *__range1;
  size_t local_100;
  property_list_type *properties_local;
  uint32_t version_local;
  ConfigureContext *ctx_local;
  BuildSystemFileDelegate *this_local;
  StringRef name_local;
  char *local_50;
  size_t local_48;
  char **local_40;
  property_list_type *local_38;
  size_t local_30;
  size_t local_28;
  property_list_type *local_20;
  char *local_18;
  int local_c;
  
  sVar5 = name.Length;
  __s1 = name.Data;
  pBVar3 = getSystemDelegate(this);
  SVar6 = llbuild::buildsystem::BuildSystemDelegate::getName(pBVar3);
  __range1 = (property_list_type *)SVar6.Data;
  local_100 = SVar6.Length;
  local_38 = __range1;
  local_30 = local_100;
  local_40 = &local_50;
  local_1bd = false;
  local_50 = __s1;
  local_48 = sVar5;
  if (sVar5 == local_100) {
    local_20 = __range1;
    local_28 = local_100;
    local_18 = __s1;
    if (local_100 == 0) {
      local_c = 0;
    }
    else {
      local_c = memcmp(__s1,__range1,local_100);
    }
    local_1bd = local_c == 0;
  }
  if (local_1bd) {
    pBVar3 = getSystemDelegate(this);
    uVar2 = llbuild::buildsystem::BuildSystemDelegate::getVersion(pBVar3);
    if (version == uVar2) {
      __end1 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin(properties);
      prop.second.field_2._8_8_ =
           std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(properties);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                         *)((long)&prop.second.field_2 + 8)), bVar1) {
        ppVar4 = __gnu_cxx::
                 __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator*(&__end1);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_160,ppVar4);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_160,"file-system");
        if (bVar1) {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&prop.first.field_2 + 8),"device-agnostic");
          if (bVar1) {
            BuildSystemImpl::configureFileSystem(this->system,1);
            goto LAB_0018691c;
          }
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&prop.first.field_2 + 8),"checksum-only");
          if (bVar1) {
            BuildSystemImpl::configureFileSystem(this->system,2);
            goto LAB_0018691c;
          }
          bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&prop.first.field_2 + 8),"default");
          if (!bVar1) goto LAB_0018691c;
          std::operator+(&local_1b8,"unsupported client file-system: \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&prop.first.field_2 + 8));
          std::operator+(&local_198,&local_1b8,"\'");
          llvm::Twine::Twine(&local_178,&local_198);
          llbuild::buildsystem::ConfigureContext::error(ctx,&local_178);
          std::__cxx11::string::~string((string *)&local_198);
          std::__cxx11::string::~string((string *)&local_1b8);
          name_local.Length._7_1_ = 0;
          bVar1 = true;
        }
        else {
LAB_0018691c:
          bVar1 = false;
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_160);
        if (bVar1) goto LAB_0018695a;
        __gnu_cxx::
        __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator++(&__end1);
      }
      name_local.Length._7_1_ = 1;
    }
    else {
      name_local.Length._7_1_ = 0;
    }
  }
  else {
    name_local.Length._7_1_ = 0;
  }
LAB_0018695a:
  return (bool)(name_local.Length._7_1_ & 1);
}

Assistant:

bool
BuildSystemFileDelegate::configureClient(const ConfigureContext& ctx,
                                         StringRef name,
                                         uint32_t version,
                                         const property_list_type& properties) {
  // The client must match the configured name of the build system.
  if (name != getSystemDelegate().getName())
    return false;

  // The client version must match the configured version.
  //
  // FIXME: We should give the client the opportunity to support a previous
  // schema version (auto-upgrade).
  if (version != getSystemDelegate().getVersion())
    return false;

  for (auto prop : properties) {
    if (prop.first == "file-system") {
      if (prop.second == "device-agnostic") {
        system.configureFileSystem(1);
      } else if (prop.second == "checksum-only") {
        system.configureFileSystem(2);
      } else if (prop.second != "default") {
        ctx.error("unsupported client file-system: '" + prop.second + "'");
        return false;
      }
    }
  }

  return true;
}